

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

Llb_Mtr_t * Llb_MtrAlloc(int nPis,int nFfs,int nCols,int nRows)

{
  Llb_Mtr_t *pLVar1;
  int *piVar2;
  Llb_Grp_t **ppLVar3;
  char **ppcVar4;
  char *pcVar5;
  int local_24;
  int i;
  Llb_Mtr_t *p;
  int nRows_local;
  int nCols_local;
  int nFfs_local;
  int nPis_local;
  
  pLVar1 = (Llb_Mtr_t *)calloc(1,0x48);
  pLVar1->nPis = nPis;
  pLVar1->nFfs = nFfs;
  pLVar1->nRows = nRows;
  pLVar1->nCols = nCols;
  piVar2 = (int *)calloc((long)nRows,4);
  pLVar1->pRowSums = piVar2;
  piVar2 = (int *)calloc((long)nCols,4);
  pLVar1->pColSums = piVar2;
  ppLVar3 = (Llb_Grp_t **)calloc((long)nCols,8);
  pLVar1->pColGrps = ppLVar3;
  ppcVar4 = (char **)calloc((long)nCols,8);
  pLVar1->pMatrix = ppcVar4;
  for (local_24 = 0; local_24 < nCols; local_24 = local_24 + 1) {
    pcVar5 = (char *)calloc((long)nRows,1);
    pLVar1->pMatrix[local_24] = pcVar5;
  }
  pcVar5 = (char *)calloc((long)nRows,1);
  pLVar1->pProdVars = pcVar5;
  piVar2 = (int *)calloc((long)nRows,4);
  pLVar1->pProdNums = piVar2;
  return pLVar1;
}

Assistant:

Llb_Mtr_t * Llb_MtrAlloc( int nPis, int nFfs, int nCols, int nRows )
{
    Llb_Mtr_t * p;
    int i;
    p = ABC_CALLOC( Llb_Mtr_t, 1 );
    p->nPis  = nPis;
    p->nFfs  = nFfs;
    p->nRows = nRows;
    p->nCols = nCols;
    p->pRowSums = ABC_CALLOC( int, nRows );
    p->pColSums = ABC_CALLOC( int, nCols );
    p->pColGrps = ABC_CALLOC( Llb_Grp_t *, nCols );
    p->pMatrix  = ABC_CALLOC( char *, nCols );
    for ( i = 0; i < nCols; i++ )
        p->pMatrix[i] = ABC_CALLOC( char, nRows );
    // partial product
    p->pProdVars = ABC_CALLOC( char, nRows );  // variables in the partial product
    p->pProdNums = ABC_CALLOC( int, nRows );   // var counts in the remaining partitions
    return p;
}